

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::MarshalAllPropertiesToScriptContext
          (PathTypeHandlerBase *this,DynamicObject *instance,ScriptContext *targetScriptContext,
          bool invalidateFixedFields)

{
  ScriptContext *scriptContext;
  PropertyRecord *pPVar1;
  Var pvVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  int slotIndex;
  PropertyIndex propertyIndex;
  uint uVar4;
  
  uVar3 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
  if ((int)CONCAT71(in_register_00000009,invalidateFixedFields) != 0) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pPVar1 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar4);
      InvalidateFixedFieldAt(this,pPVar1->pid,(PropertyIndex)uVar4,scriptContext);
    }
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pvVar2 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,uVar4);
    pvVar2 = CrossSite::MarshalVar(targetScriptContext,pvVar2,false);
    DynamicTypeHandler::SetSlotUnchecked(instance,uVar4,pvVar2);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        for (int slotIndex = 0; slotIndex < propertyCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, slotIndex)));
        }
    }